

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

int Dau_DecCheckSetTop5(word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int uMaskS,int *pSched,
                       word *pDec,word *pComp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  word wVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  word awStack_630 [38];
  uint local_500;
  int iMintB;
  int MintS;
  int MintB;
  int Mint;
  int m;
  int v;
  int b;
  int s;
  int nMintsS;
  int nMintsB;
  int nMints;
  int pVarsB [16];
  int pVarsS [16];
  int MaskF;
  int ShiftF;
  word MaskFF;
  word Value;
  word Cof [2] [64];
  int uMaskS_local;
  int nVarsS_local;
  int nVarsB_local;
  int nVarsF_local;
  int nVars_local;
  word *p_local;
  
  bVar6 = (byte)nVarsF;
  bVar7 = 6 - bVar6;
  uVar1 = (1 << (bVar7 & 0x1f)) - 1;
  iVar2 = 1 << ((byte)nVarsS & 0x1f);
  if (nVars != nVarsB + nVarsF) {
    __assert_fail("nVars == nVarsB + nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x38,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x39,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (6 < nVarsS) {
    __assert_fail("nVarsS <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x3a,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if ((0 < nVarsF) && (nVarsF < 6)) {
    m = 0;
    v = 0;
    for (Mint = 0; Mint < nVarsB; Mint = Mint + 1) {
      if ((uMaskS >> ((byte)Mint & 0x1f) & 1U) == 0) {
        pVarsB[(long)Mint + 0xe] = -1;
        (&nMintsB)[Mint] = m;
        m = m + 1;
      }
      else {
        (&nMintsB)[Mint] = -1;
        pVarsB[(long)Mint + 0xe] = v;
        v = v + 1;
      }
    }
    if (v == nVarsS) {
      if (m != nVarsB - nVarsS) {
        __assert_fail("b == nVarsB-nVarsS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                      ,0x43,
                      "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)"
                     );
      }
      for (v = 0; v < iVar2; v = v + 1) {
        Cof[0][(long)v + 0x3f] = 0xffffffffffffffff;
        Cof[-1][(long)v + 0x3f] = 0xffffffffffffffff;
      }
      MintB = 0;
      MintS = 0;
      iMintB = 0;
      local_500 = 0;
      do {
        if (1 << ((byte)nVarsB & 0x1f) <= MintB) {
          if (pComp != (word *)0x0) {
            for (v = 0; v < iVar2; v = v + 1) {
              iVar3 = v >> (bVar7 & 0x1f);
              pComp[iVar3] = Cof[-1][(long)v + 0x3f] <<
                             ((byte)((v & uVar1) << (bVar6 & 0x1f)) & 0x3f) | pComp[iVar3];
              if (Cof[0][(long)v + 0x3f] == 0xffffffffffffffff) {
                iVar3 = v + iVar2 >> (bVar7 & 0x1f);
                pComp[iVar3] = Cof[-1][(long)v + 0x3f] <<
                               ((byte)((v + iVar2 & uVar1) << (bVar6 & 0x1f)) & 0x3f) | pComp[iVar3]
                ;
              }
              else {
                iVar3 = v + iVar2 >> (bVar7 & 0x1f);
                pComp[iVar3] = Cof[0][(long)v + 0x3f] <<
                               ((byte)((v + iVar2 & uVar1) << (bVar6 & 0x1f)) & 0x3f) | pComp[iVar3]
                ;
              }
            }
            if (nVarsF + nVarsS + 1 < 6) {
              wVar5 = Abc_Tt6Stretch(*pComp,nVarsF + nVarsS + 1);
              *pComp = wVar5;
            }
          }
          if ((pDec != (word *)0x0) && (nVarsB < 6)) {
            wVar5 = Abc_Tt6Stretch(*pDec,nVarsB);
            *pDec = wVar5;
          }
          return 1;
        }
        uVar4 = p[MintS >> (bVar7 & 0x1f)] >> ((byte)((MintS & uVar1) << (bVar6 & 0x1f)) & 0x3f) &
                (1L << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) - 1U;
        if ((Cof[-1][(long)(int)local_500 + 0x3f] == 0xffffffffffffffff) ||
           (Cof[-1][(long)(int)local_500 + 0x3f] == uVar4)) {
          Cof[-1][(long)(int)local_500 + 0x3f] = uVar4;
        }
        else {
          if ((Cof[0][(long)(int)local_500 + 0x3f] != 0xffffffffffffffff) &&
             (Cof[0][(long)(int)local_500 + 0x3f] != uVar4)) {
            return 0;
          }
          Cof[0][(long)(int)local_500 + 0x3f] = uVar4;
          if (pDec != (word *)0x0) {
            iVar3 = local_500 * (1 << ((byte)nVarsB - (byte)nVarsS & 0x1f)) + iMintB;
            iVar8 = iVar3 >> 6;
            pDec[iVar8] = 1L << ((byte)iVar3 & 0x3f) | pDec[iVar8];
          }
        }
        iVar3 = pSched[MintB];
        MintS = 1 << ((byte)iVar3 & 0x1f) ^ MintS;
        if ((uMaskS >> ((byte)iVar3 & 0x1f) & 1U) == 0) {
          iMintB = 1 << ((byte)(&nMintsB)[iVar3] & 0x1f) ^ iMintB;
        }
        else {
          local_500 = 1 << ((byte)pVarsB[(long)iVar3 + 0xe] & 0x1f) ^ local_500;
        }
        MintB = MintB + 1;
      } while( true );
    }
    __assert_fail("s == nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x42,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  __assert_fail("nVarsF >= 1 && nVarsF <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                ,0x3b,
                "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Checks decomposability with given variable set.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DecCheckSetTop5( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int uMaskS, int * pSched, word * pDec, word * pComp )
{
    word Cof[2][64], Value;
    word MaskFF = (((word)1) << (1 << nVarsF)) - 1;
    int ShiftF = 6 - nVarsF, MaskF = (1 << ShiftF) - 1;
    int pVarsS[16], pVarsB[16];
    int nMints  = (1 << nVarsB);
    int nMintsB = (1 <<(nVarsB-nVarsS));
    int nMintsS = (1 << nVarsS);
    int s, b, v, m, Mint, MintB, MintS;
    assert( nVars == nVarsB + nVarsF );
    assert( nVars <= 16 );
    assert( nVarsS <= 6 );
    assert( nVarsF >= 1 && nVarsF <= 5 );
    // collect bound/shared variables
    for ( s = b = v = 0; v < nVarsB; v++ )
        if ( (uMaskS >> v) & 1 )
            pVarsB[v] = -1, pVarsS[v] = s++;
        else
            pVarsS[v] = -1, pVarsB[v] = b++;
    assert( s == nVarsS );
    assert( b == nVarsB-nVarsS );
    // clean minterm storage
    for ( s = 0; s < nMintsS; s++ )
        Cof[0][s] = Cof[1][s] = ~(word)0;
    // iterate through bound set minters
    for ( MintS = MintB = Mint = m = 0; m < nMints; m++ )
    {
        // find minterm value
        Value = (p[Mint>>ShiftF] >> ((Mint&MaskF)<<nVarsF)) & MaskFF;
        // check if this cof already appeared 
        if ( !~Cof[0][MintS] || Cof[0][MintS] == Value )
            Cof[0][MintS] = Value;
        else if ( !~Cof[1][MintS] || Cof[1][MintS] == Value )
        {
            Cof[1][MintS] = Value;
            if ( pDec ) 
            {
                int iMintB = MintS * nMintsB + MintB;
                pDec[iMintB>>6] |= (((word)1)<<(iMintB & 63));     
            }
        }
        else
            return 0;            
        // find next minterm
        v = pSched[m];
        Mint ^= (1 << v);
        if ( (uMaskS >> v) & 1 ) // shared variable
            MintS ^= (1 << pVarsS[v]);
        else
            MintB ^= (1 << pVarsB[v]);
    }
    // create composition function
    if ( pComp )
    {
        for ( s = 0; s < nMintsS; s++ )
        {
            pComp[s>>ShiftF] |= (Cof[0][s] << ((s&MaskF) << nVarsF));
            if ( ~Cof[1][s] ) 
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[1][s] << (((s+nMintsS)&MaskF) << nVarsF));
            else
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[0][s] << (((s+nMintsS)&MaskF) << nVarsF));
        }
        if ( nVarsF + nVarsS + 1 < 6 )
            pComp[0] = Abc_Tt6Stretch( pComp[0], nVarsF + nVarsS + 1 );
    }
    if ( pDec && nVarsB < 6 )
        pDec[0] = Abc_Tt6Stretch( pDec[0], nVarsB );
    return 1;
}